

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-test.cc
# Opt level: O0

void __thiscall FormatterTest_Width_Test::TestBody(FormatterTest_Width_Test *this)

{
  bool bVar1;
  undefined1 uVar2;
  undefined1 uVar3;
  undefined1 uVar4;
  char *pcVar5;
  AssertionResult gtest_ar_14;
  AssertionResult gtest_ar_13;
  AssertionResult gtest_ar_12;
  AssertionResult gtest_ar_11;
  AssertionResult gtest_ar_10;
  AssertionResult gtest_ar_9;
  AssertionResult gtest_ar_8;
  AssertionResult gtest_ar_7;
  AssertionResult gtest_ar_6;
  AssertionResult gtest_ar_5;
  AssertionResult gtest_ar_4;
  format_error *e_3;
  bool gtest_caught_expected_3;
  string gtest_expected_message_3;
  AssertionResult gtest_ar_3;
  format_error *e_2;
  bool gtest_caught_expected_2;
  string gtest_expected_message_2;
  AssertionResult gtest_ar_2;
  format_error *e_1;
  bool gtest_caught_expected_1;
  string gtest_expected_message_1;
  AssertionResult gtest_ar_1;
  size_t size;
  format_error *e;
  bool gtest_caught_expected;
  string gtest_expected_message;
  AssertionResult gtest_ar;
  char format_str [256];
  undefined7 in_stack_fffffffffffff780;
  undefined1 in_stack_fffffffffffff787;
  char (*in_stack_fffffffffffff788) [12];
  string *expected;
  char *in_stack_fffffffffffff790;
  undefined4 in_stack_fffffffffffff798;
  int in_stack_fffffffffffff79c;
  int line;
  char *in_stack_fffffffffffff7a0;
  string *file;
  char (*in_stack_fffffffffffff7a8) [103];
  Type type;
  undefined7 in_stack_fffffffffffff7b0;
  undefined1 in_stack_fffffffffffff7b7;
  char (*in_stack_fffffffffffff7b8) [256];
  string *format_str_00;
  undefined7 in_stack_fffffffffffff7f8;
  undefined1 in_stack_fffffffffffff7ff;
  AssertHelper *in_stack_fffffffffffff800;
  AssertHelper *this_00;
  string local_628 [32];
  AssertionResult local_608 [2];
  undefined1 local_5e1;
  string local_5e0 [32];
  AssertionResult local_5c0 [2];
  undefined8 local_5a0;
  string local_598 [32];
  AssertionResult local_578 [2];
  unkbyte10 local_558;
  string local_548 [32];
  AssertionResult local_528 [2];
  undefined8 local_508;
  string local_500 [32];
  AssertionResult local_4e0 [2];
  undefined8 local_4c0;
  AssertHelper local_4b8 [4];
  AssertionResult local_498 [2];
  undefined8 local_478;
  string local_470 [32];
  AssertionResult local_450 [2];
  undefined8 local_430;
  string local_428 [32];
  AssertionResult local_408 [2];
  undefined8 local_3e8;
  string local_3e0 [32];
  AssertionResult local_3c0 [2];
  undefined4 local_39c;
  string local_398 [32];
  AssertionResult local_378 [2];
  undefined4 local_354;
  string local_350 [32];
  AssertionResult local_330 [3];
  undefined4 local_2fc;
  string local_2f8 [38];
  byte local_2d2;
  allocator local_2d1;
  string local_2d0 [32];
  AssertionResult local_2b0 [3];
  undefined4 local_27c;
  string local_278 [38];
  byte local_252;
  allocator local_251;
  string local_250 [32];
  AssertionResult local_230 [3];
  undefined4 local_1fc;
  string local_1f8 [38];
  byte local_1d2;
  allocator local_1d1;
  string local_1d0 [32];
  AssertionResult local_1b0;
  size_t local_1a0;
  int local_178;
  undefined4 local_174;
  string local_170 [38];
  byte local_14a;
  allocator local_149;
  string local_148 [48];
  AssertionResult local_118;
  char local_108 [264];
  
  safe_sprintf<256ul>((char (*) [256])local_108,"{0:%u",0xffffffff);
  increment((char *)CONCAT17(in_stack_fffffffffffff787,in_stack_fffffffffffff780));
  testing::AssertionSuccess();
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_118);
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_148,"number is too big",&local_149);
    std::allocator<char>::~allocator((allocator<char> *)&local_149);
    local_14a = 0;
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      local_174 = 0;
      fmt::v5::format<char[256],int>
                (in_stack_fffffffffffff7b8,
                 (int *)CONCAT17(in_stack_fffffffffffff7b7,in_stack_fffffffffffff7b0));
      std::__cxx11::string::~string(local_170);
    }
    if ((local_14a & 1) == 0) {
      testing::AssertionResult::operator<<
                ((AssertionResult *)CONCAT17(in_stack_fffffffffffff7b7,in_stack_fffffffffffff7b0),
                 in_stack_fffffffffffff7a8);
      local_178 = 2;
    }
    else {
      local_178 = 0;
    }
    std::__cxx11::string::~string(local_148);
    if (local_178 != 0) goto LAB_0014e49c;
  }
  else {
LAB_0014e49c:
    testing::Message::Message
              ((Message *)CONCAT17(in_stack_fffffffffffff7b7,in_stack_fffffffffffff7b0));
    testing::AssertionResult::failure_message((AssertionResult *)0x14e4b8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffff7b7,in_stack_fffffffffffff7b0),
               (Type)((ulong)in_stack_fffffffffffff7a8 >> 0x20),in_stack_fffffffffffff7a0,
               in_stack_fffffffffffff79c,in_stack_fffffffffffff790);
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffff800,
               (Message *)CONCAT17(in_stack_fffffffffffff7ff,in_stack_fffffffffffff7f8));
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffff787,in_stack_fffffffffffff780));
    testing::Message::~Message((Message *)0x14e51b);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x14e573);
  local_1a0 = strlen(local_108);
  local_108[local_1a0] = '}';
  local_108[local_1a0 + 1] = '\0';
  testing::AssertionSuccess();
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_1b0);
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_1d0,"number is too big",&local_1d1);
    std::allocator<char>::~allocator((allocator<char> *)&local_1d1);
    local_1d2 = 0;
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      local_1fc = 0;
      fmt::v5::format<char[256],int>
                (in_stack_fffffffffffff7b8,
                 (int *)CONCAT17(in_stack_fffffffffffff7b7,in_stack_fffffffffffff7b0));
      std::__cxx11::string::~string(local_1f8);
    }
    if ((local_1d2 & 1) == 0) {
      testing::AssertionResult::operator<<
                ((AssertionResult *)CONCAT17(in_stack_fffffffffffff7b7,in_stack_fffffffffffff7b0),
                 in_stack_fffffffffffff7a8);
      local_178 = 3;
    }
    else {
      local_178 = 0;
    }
    std::__cxx11::string::~string(local_1d0);
    if (local_178 != 0) goto LAB_0014e95c;
  }
  else {
LAB_0014e95c:
    testing::Message::Message
              ((Message *)CONCAT17(in_stack_fffffffffffff7b7,in_stack_fffffffffffff7b0));
    testing::AssertionResult::failure_message((AssertionResult *)0x14e978);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffff7b7,in_stack_fffffffffffff7b0),
               (Type)((ulong)in_stack_fffffffffffff7a8 >> 0x20),in_stack_fffffffffffff7a0,
               in_stack_fffffffffffff79c,in_stack_fffffffffffff790);
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffff800,
               (Message *)CONCAT17(in_stack_fffffffffffff7ff,in_stack_fffffffffffff7f8));
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffff787,in_stack_fffffffffffff780));
    testing::Message::~Message((Message *)0x14e9db);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x14ea33);
  safe_sprintf<256ul>((char (*) [256])local_108,"{0:%u",0x80000000);
  testing::AssertionSuccess();
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_230);
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_250,"number is too big",&local_251);
    std::allocator<char>::~allocator((allocator<char> *)&local_251);
    local_252 = 0;
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      local_27c = 0;
      fmt::v5::format<char[256],int>
                (in_stack_fffffffffffff7b8,
                 (int *)CONCAT17(in_stack_fffffffffffff7b7,in_stack_fffffffffffff7b0));
      std::__cxx11::string::~string(local_278);
    }
    if ((local_252 & 1) == 0) {
      testing::AssertionResult::operator<<
                ((AssertionResult *)CONCAT17(in_stack_fffffffffffff7b7,in_stack_fffffffffffff7b0),
                 in_stack_fffffffffffff7a8);
      local_178 = 4;
    }
    else {
      local_178 = 0;
    }
    std::__cxx11::string::~string(local_250);
    if (local_178 != 0) goto LAB_0014edf5;
  }
  else {
LAB_0014edf5:
    testing::Message::Message
              ((Message *)CONCAT17(in_stack_fffffffffffff7b7,in_stack_fffffffffffff7b0));
    testing::AssertionResult::failure_message((AssertionResult *)0x14ee11);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffff7b7,in_stack_fffffffffffff7b0),
               (Type)((ulong)in_stack_fffffffffffff7a8 >> 0x20),in_stack_fffffffffffff7a0,
               in_stack_fffffffffffff79c,in_stack_fffffffffffff790);
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffff800,
               (Message *)CONCAT17(in_stack_fffffffffffff7ff,in_stack_fffffffffffff7f8));
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffff787,in_stack_fffffffffffff780));
    testing::Message::~Message((Message *)0x14ee74);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x14eecc);
  safe_sprintf<256ul>((char (*) [256])local_108,"{0:%u}",0x80000000);
  testing::AssertionSuccess();
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_2b0);
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_2d0,"number is too big",&local_2d1);
    std::allocator<char>::~allocator((allocator<char> *)&local_2d1);
    local_2d2 = 0;
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      local_2fc = 0;
      fmt::v5::format<char[256],int>
                (in_stack_fffffffffffff7b8,
                 (int *)CONCAT17(in_stack_fffffffffffff7b7,in_stack_fffffffffffff7b0));
      std::__cxx11::string::~string(local_2f8);
    }
    if ((local_2d2 & 1) == 0) {
      testing::AssertionResult::operator<<
                ((AssertionResult *)CONCAT17(in_stack_fffffffffffff7b7,in_stack_fffffffffffff7b0),
                 in_stack_fffffffffffff7a8);
      local_178 = 5;
    }
    else {
      local_178 = 0;
    }
    std::__cxx11::string::~string(local_2d0);
    type = (Type)((ulong)in_stack_fffffffffffff7a8 >> 0x20);
    if (local_178 == 0) goto LAB_0014f358;
  }
  type = (Type)((ulong)in_stack_fffffffffffff7a8 >> 0x20);
  testing::Message::Message
            ((Message *)CONCAT17(in_stack_fffffffffffff7b7,in_stack_fffffffffffff7b0));
  testing::AssertionResult::failure_message((AssertionResult *)0x14f2aa);
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)CONCAT17(in_stack_fffffffffffff7b7,in_stack_fffffffffffff7b0),type,
             in_stack_fffffffffffff7a0,in_stack_fffffffffffff79c,in_stack_fffffffffffff790);
  testing::internal::AssertHelper::operator=
            (in_stack_fffffffffffff800,
             (Message *)CONCAT17(in_stack_fffffffffffff7ff,in_stack_fffffffffffff7f8));
  testing::internal::AssertHelper::~AssertHelper
            ((AssertHelper *)CONCAT17(in_stack_fffffffffffff787,in_stack_fffffffffffff780));
  testing::Message::~Message((Message *)0x14f30d);
LAB_0014f358:
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x14f365);
  local_354 = 0xffffffd6;
  fmt::v5::format<char[6],int>
            ((char (*) [6])in_stack_fffffffffffff7b8,
             (int *)CONCAT17(in_stack_fffffffffffff7b7,in_stack_fffffffffffff7b0));
  testing::internal::EqHelper<false>::Compare<char[5],std::__cxx11::string>
            ((char *)CONCAT44(in_stack_fffffffffffff79c,in_stack_fffffffffffff798),
             in_stack_fffffffffffff790,(char (*) [5])in_stack_fffffffffffff788,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff787,in_stack_fffffffffffff780));
  std::__cxx11::string::~string(local_350);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_330);
  if (!bVar1) {
    testing::Message::Message
              ((Message *)CONCAT17(in_stack_fffffffffffff7b7,in_stack_fffffffffffff7b0));
    testing::AssertionResult::failure_message((AssertionResult *)0x14f462);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffff7b7,in_stack_fffffffffffff7b0),type,
               in_stack_fffffffffffff7a0,in_stack_fffffffffffff79c,in_stack_fffffffffffff790);
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffff800,
               (Message *)CONCAT17(in_stack_fffffffffffff7ff,in_stack_fffffffffffff7f8));
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffff787,in_stack_fffffffffffff780));
    testing::Message::~Message((Message *)0x14f4c5);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x14f51d);
  local_39c = 0x2a;
  fmt::v5::format<char[6],unsigned_int>
            ((char (*) [6])in_stack_fffffffffffff7b8,
             (uint *)CONCAT17(in_stack_fffffffffffff7b7,in_stack_fffffffffffff7b0));
  testing::internal::EqHelper<false>::Compare<char[6],std::__cxx11::string>
            ((char *)CONCAT44(in_stack_fffffffffffff79c,in_stack_fffffffffffff798),
             in_stack_fffffffffffff790,(char (*) [6])in_stack_fffffffffffff788,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff787,in_stack_fffffffffffff780));
  std::__cxx11::string::~string(local_398);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_378);
  if (!bVar1) {
    testing::Message::Message
              ((Message *)CONCAT17(in_stack_fffffffffffff7b7,in_stack_fffffffffffff7b0));
    testing::AssertionResult::failure_message((AssertionResult *)0x14f61a);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffff7b7,in_stack_fffffffffffff7b0),type,
               in_stack_fffffffffffff7a0,in_stack_fffffffffffff79c,in_stack_fffffffffffff790);
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffff800,
               (Message *)CONCAT17(in_stack_fffffffffffff7ff,in_stack_fffffffffffff7f8));
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffff787,in_stack_fffffffffffff780));
    testing::Message::~Message((Message *)0x14f67d);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x14f6d5);
  local_3e8 = 0xffffffffffffffd6;
  fmt::v5::format<char[6],long>
            ((char (*) [6])in_stack_fffffffffffff7b8,
             (long *)CONCAT17(in_stack_fffffffffffff7b7,in_stack_fffffffffffff7b0));
  testing::internal::EqHelper<false>::Compare<char[7],std::__cxx11::string>
            ((char *)CONCAT44(in_stack_fffffffffffff79c,in_stack_fffffffffffff798),
             in_stack_fffffffffffff790,(char (*) [7])in_stack_fffffffffffff788,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff787,in_stack_fffffffffffff780));
  std::__cxx11::string::~string(local_3e0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_3c0);
  if (!bVar1) {
    testing::Message::Message
              ((Message *)CONCAT17(in_stack_fffffffffffff7b7,in_stack_fffffffffffff7b0));
    testing::AssertionResult::failure_message((AssertionResult *)0x14f7d3);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffff7b7,in_stack_fffffffffffff7b0),type,
               in_stack_fffffffffffff7a0,in_stack_fffffffffffff79c,in_stack_fffffffffffff790);
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffff800,
               (Message *)CONCAT17(in_stack_fffffffffffff7ff,in_stack_fffffffffffff7f8));
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffff787,in_stack_fffffffffffff780));
    testing::Message::~Message((Message *)0x14f836);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x14f88e);
  local_430 = 0x2a;
  fmt::v5::format<char[6],unsigned_long>
            ((char (*) [6])in_stack_fffffffffffff7b8,
             (unsigned_long *)CONCAT17(in_stack_fffffffffffff7b7,in_stack_fffffffffffff7b0));
  testing::internal::EqHelper<false>::Compare<char[8],std::__cxx11::string>
            ((char *)CONCAT44(in_stack_fffffffffffff79c,in_stack_fffffffffffff798),
             in_stack_fffffffffffff790,(char (*) [8])in_stack_fffffffffffff788,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff787,in_stack_fffffffffffff780));
  std::__cxx11::string::~string(local_428);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_408);
  if (!bVar1) {
    testing::Message::Message
              ((Message *)CONCAT17(in_stack_fffffffffffff7b7,in_stack_fffffffffffff7b0));
    testing::AssertionResult::failure_message((AssertionResult *)0x14f98c);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffff7b7,in_stack_fffffffffffff7b0),type,
               in_stack_fffffffffffff7a0,in_stack_fffffffffffff79c,in_stack_fffffffffffff790);
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffff800,
               (Message *)CONCAT17(in_stack_fffffffffffff7ff,in_stack_fffffffffffff7f8));
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffff787,in_stack_fffffffffffff780));
    testing::Message::~Message((Message *)0x14f9ef);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x14fa47);
  local_478 = 0xffffffffffffffd6;
  fmt::v5::format<char[6],long_long>
            ((char (*) [6])in_stack_fffffffffffff7b8,
             (longlong *)CONCAT17(in_stack_fffffffffffff7b7,in_stack_fffffffffffff7b0));
  testing::internal::EqHelper<false>::Compare<char[7],std::__cxx11::string>
            ((char *)CONCAT44(in_stack_fffffffffffff79c,in_stack_fffffffffffff798),
             in_stack_fffffffffffff790,(char (*) [7])in_stack_fffffffffffff788,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff787,in_stack_fffffffffffff780));
  std::__cxx11::string::~string(local_470);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_450);
  if (!bVar1) {
    testing::Message::Message
              ((Message *)CONCAT17(in_stack_fffffffffffff7b7,in_stack_fffffffffffff7b0));
    testing::AssertionResult::failure_message((AssertionResult *)0x14fb45);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffff7b7,in_stack_fffffffffffff7b0),type,
               in_stack_fffffffffffff7a0,in_stack_fffffffffffff79c,in_stack_fffffffffffff790);
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffff800,
               (Message *)CONCAT17(in_stack_fffffffffffff7ff,in_stack_fffffffffffff7f8));
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffff787,in_stack_fffffffffffff780));
    testing::Message::~Message((Message *)0x14fba8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x14fc00);
  local_4c0 = 0x2a;
  this_00 = local_4b8;
  fmt::v5::format<char[6],unsigned_long_long>
            ((char (*) [6])in_stack_fffffffffffff7b8,
             (unsigned_long_long *)CONCAT17(in_stack_fffffffffffff7b7,in_stack_fffffffffffff7b0));
  testing::internal::EqHelper<false>::Compare<char[8],std::__cxx11::string>
            ((char *)CONCAT44(in_stack_fffffffffffff79c,in_stack_fffffffffffff798),
             in_stack_fffffffffffff790,(char (*) [8])in_stack_fffffffffffff788,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff787,in_stack_fffffffffffff780));
  std::__cxx11::string::~string((string *)local_4b8);
  uVar2 = testing::AssertionResult::operator_cast_to_bool(local_498);
  if (!(bool)uVar2) {
    testing::Message::Message
              ((Message *)CONCAT17(in_stack_fffffffffffff7b7,in_stack_fffffffffffff7b0));
    testing::AssertionResult::failure_message((AssertionResult *)0x14fcfe);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffff7b7,in_stack_fffffffffffff7b0),type,
               in_stack_fffffffffffff7a0,in_stack_fffffffffffff79c,in_stack_fffffffffffff790);
    testing::internal::AssertHelper::operator=
              (this_00,(Message *)CONCAT17(uVar2,in_stack_fffffffffffff7f8));
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffff787,in_stack_fffffffffffff780));
    testing::Message::~Message((Message *)0x14fd5b);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x14fdb3);
  local_508 = 0xbff3ae147ae147ae;
  fmt::v5::format<char[6],double>
            ((char (*) [6])in_stack_fffffffffffff7b8,
             (double *)CONCAT17(in_stack_fffffffffffff7b7,in_stack_fffffffffffff7b0));
  testing::internal::EqHelper<false>::Compare<char[9],std::__cxx11::string>
            ((char *)CONCAT44(in_stack_fffffffffffff79c,in_stack_fffffffffffff798),
             in_stack_fffffffffffff790,(char (*) [9])in_stack_fffffffffffff788,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff787,in_stack_fffffffffffff780));
  std::__cxx11::string::~string(local_500);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_4e0);
  if (!bVar1) {
    testing::Message::Message
              ((Message *)CONCAT17(in_stack_fffffffffffff7b7,in_stack_fffffffffffff7b0));
    testing::AssertionResult::failure_message((AssertionResult *)0x14feab);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffff7b7,in_stack_fffffffffffff7b0),type,
               in_stack_fffffffffffff7a0,in_stack_fffffffffffff79c,in_stack_fffffffffffff790);
    testing::internal::AssertHelper::operator=
              (this_00,(Message *)CONCAT17(uVar2,in_stack_fffffffffffff7f8));
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffff787,in_stack_fffffffffffff780));
    testing::Message::~Message((Message *)0x14ff08);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x14ff60);
  local_558 = _DAT_00338090;
  fmt::v5::format<char[6],long_double>
            ((char (*) [6])in_stack_fffffffffffff7b8,
             (longdouble *)CONCAT17(in_stack_fffffffffffff7b7,in_stack_fffffffffffff7b0));
  testing::internal::EqHelper<false>::Compare<char[10],std::__cxx11::string>
            ((char *)CONCAT44(in_stack_fffffffffffff79c,in_stack_fffffffffffff798),
             in_stack_fffffffffffff790,(char (*) [10])in_stack_fffffffffffff788,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff787,in_stack_fffffffffffff780));
  std::__cxx11::string::~string(local_548);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_528);
  if (!bVar1) {
    testing::Message::Message
              ((Message *)CONCAT17(in_stack_fffffffffffff7b7,in_stack_fffffffffffff7b0));
    testing::AssertionResult::failure_message((AssertionResult *)0x150053);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffff7b7,in_stack_fffffffffffff7b0),type,
               in_stack_fffffffffffff7a0,in_stack_fffffffffffff79c,in_stack_fffffffffffff790);
    testing::internal::AssertHelper::operator=
              (this_00,(Message *)CONCAT17(uVar2,in_stack_fffffffffffff7f8));
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffff787,in_stack_fffffffffffff780));
    testing::Message::~Message((Message *)0x1500b0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x150108);
  local_5a0 = 0xcafe;
  format_str_00 = local_598;
  fmt::v5::format<char[7],void*>
            ((char (*) [7])format_str_00,
             (void **)CONCAT17(in_stack_fffffffffffff7b7,in_stack_fffffffffffff7b0));
  testing::internal::EqHelper<false>::Compare<char[11],std::__cxx11::string>
            ((char *)CONCAT44(in_stack_fffffffffffff79c,in_stack_fffffffffffff798),
             in_stack_fffffffffffff790,(char (*) [11])in_stack_fffffffffffff788,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff787,in_stack_fffffffffffff780));
  std::__cxx11::string::~string(local_598);
  uVar3 = testing::AssertionResult::operator_cast_to_bool(local_578);
  if (!(bool)uVar3) {
    testing::Message::Message((Message *)CONCAT17(uVar3,in_stack_fffffffffffff7b0));
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)0x1501fa);
    type = (Type)((ulong)pcVar5 >> 0x20);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)CONCAT17(uVar3,in_stack_fffffffffffff7b0),type,
               in_stack_fffffffffffff7a0,in_stack_fffffffffffff79c,in_stack_fffffffffffff790);
    testing::internal::AssertHelper::operator=
              (this_00,(Message *)CONCAT17(uVar2,in_stack_fffffffffffff7f8));
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffff787,in_stack_fffffffffffff780));
    testing::Message::~Message((Message *)0x150257);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1502af);
  local_5e1 = 0x78;
  file = local_5e0;
  fmt::v5::format<char[7],char>
            ((char (*) [7])format_str_00,(char *)CONCAT17(uVar3,in_stack_fffffffffffff7b0));
  testing::internal::EqHelper<false>::Compare<char[12],std::__cxx11::string>
            ((char *)CONCAT44(in_stack_fffffffffffff79c,in_stack_fffffffffffff798),
             in_stack_fffffffffffff790,in_stack_fffffffffffff788,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff787,in_stack_fffffffffffff780));
  std::__cxx11::string::~string(local_5e0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_5c0);
  line = CONCAT13(bVar1,(int3)in_stack_fffffffffffff79c);
  if (!bVar1) {
    testing::Message::Message((Message *)CONCAT17(uVar3,in_stack_fffffffffffff7b0));
    in_stack_fffffffffffff790 =
         testing::AssertionResult::failure_message((AssertionResult *)0x15039d);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)CONCAT17(uVar3,in_stack_fffffffffffff7b0),type,(char *)file,line,
               in_stack_fffffffffffff790);
    testing::internal::AssertHelper::operator=
              (this_00,(Message *)CONCAT17(uVar2,in_stack_fffffffffffff7f8));
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffff787,in_stack_fffffffffffff780));
    testing::Message::~Message((Message *)0x1503fa);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x150452);
  expected = local_628;
  fmt::v5::format<char[7],char[4]>
            ((char (*) [7])format_str_00,(char (*) [4])CONCAT17(uVar3,in_stack_fffffffffffff7b0));
  testing::internal::EqHelper<false>::Compare<char[13],std::__cxx11::string>
            ((char *)CONCAT44(line,in_stack_fffffffffffff798),in_stack_fffffffffffff790,
             (char (*) [13])expected,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff787,in_stack_fffffffffffff780));
  std::__cxx11::string::~string(local_628);
  uVar4 = testing::AssertionResult::operator_cast_to_bool(local_608);
  if (!(bool)uVar4) {
    testing::Message::Message((Message *)CONCAT17(uVar3,in_stack_fffffffffffff7b0));
    testing::AssertionResult::failure_message((AssertionResult *)0x150537);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)CONCAT17(uVar3,in_stack_fffffffffffff7b0),type,(char *)file,line,
               in_stack_fffffffffffff790);
    testing::internal::AssertHelper::operator=
              (this_00,(Message *)CONCAT17(uVar2,in_stack_fffffffffffff7f8));
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT17(uVar4,in_stack_fffffffffffff780));
    testing::Message::~Message((Message *)0x150592);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1505e7);
  return;
}

Assistant:

TEST(FormatterTest, Width) {
  char format_str[BUFFER_SIZE];
  safe_sprintf(format_str, "{0:%u", UINT_MAX);
  increment(format_str + 3);
  EXPECT_THROW_MSG(format(format_str, 0), format_error, "number is too big");
  std::size_t size = std::strlen(format_str);
  format_str[size] = '}';
  format_str[size + 1] = 0;
  EXPECT_THROW_MSG(format(format_str, 0), format_error, "number is too big");

  safe_sprintf(format_str, "{0:%u", INT_MAX + 1u);
  EXPECT_THROW_MSG(format(format_str, 0), format_error, "number is too big");
  safe_sprintf(format_str, "{0:%u}", INT_MAX + 1u);
  EXPECT_THROW_MSG(format(format_str, 0), format_error, "number is too big");
  EXPECT_EQ(" -42", format("{0:4}", -42));
  EXPECT_EQ("   42", format("{0:5}", 42u));
  EXPECT_EQ("   -42", format("{0:6}", -42l));
  EXPECT_EQ("     42", format("{0:7}", 42ul));
  EXPECT_EQ("   -42", format("{0:6}", -42ll));
  EXPECT_EQ("     42", format("{0:7}", 42ull));
  EXPECT_EQ("   -1.23", format("{0:8}", -1.23));
  EXPECT_EQ("    -1.23", format("{0:9}", -1.23l));
  EXPECT_EQ("    0xcafe", format("{0:10}", reinterpret_cast<void*>(0xcafe)));
  EXPECT_EQ("x          ", format("{0:11}", 'x'));
  EXPECT_EQ("str         ", format("{0:12}", "str"));
}